

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O3

bool __thiscall
Inputs::Keyboard::set_key_pressed(Keyboard *this,Key key,char param_2,bool is_pressed,bool param_4)

{
  Delegate *pDVar1;
  _Bit_type *p_Var2;
  int iVar3;
  ulong uVar5;
  ulong uVar6;
  Key KVar4;
  
  uVar6 = (ulong)(int)key;
  p_Var2 = (this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var2) * 8 <=
      uVar6) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->key_states_,uVar6 + 1,false);
    p_Var2 = (this->key_states_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  KVar4 = key + B;
  if (-1 < (int)key) {
    KVar4 = key;
  }
  iVar3 = (int)KVar4 >> 6;
  uVar5 = (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001);
  uVar6 = 1L << ((byte)key & 0x3f);
  if (is_pressed) {
    uVar6 = uVar6 | p_Var2[(long)iVar3 + uVar5 + 0xffffffffffffffff];
  }
  else {
    uVar6 = ~uVar6 & p_Var2[(long)iVar3 + uVar5 + 0xffffffffffffffff];
  }
  p_Var2[(long)iVar3 + uVar5 + 0xffffffffffffffff] = uVar6;
  pDVar1 = this->delegate_;
  if (pDVar1 != (Delegate *)0x0) {
    iVar3 = (**pDVar1->_vptr_Delegate)(pDVar1,this,key,(ulong)is_pressed);
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool Keyboard::set_key_pressed(Key key, char, bool is_pressed, bool) {
	const size_t key_offset = size_t(key);
	if(key_offset >= key_states_.size()) {
		key_states_.resize(key_offset+1, false);
	}
	key_states_[key_offset] = is_pressed;

	if(delegate_) return delegate_->keyboard_did_change_key(this, key, is_pressed);
	return false;
}